

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool cmDependsFortranStreamsDiffer(istream *ifs1,istream *ifs2)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int ifs2_c;
  int ifs1_c;
  istream *ifs2_local;
  istream *ifs1_local;
  
  do {
    iVar1 = std::istream::get();
    iVar2 = std::istream::get();
    uVar3 = std::ios::operator!((ios *)(ifs1 + *(long *)(*(long *)ifs1 + -0x18)));
    if (((uVar3 & 1) != 0) &&
       (uVar3 = std::ios::operator!((ios *)(ifs2 + *(long *)(*(long *)ifs2 + -0x18))),
       (uVar3 & 1) != 0)) {
      return false;
    }
    uVar3 = std::ios::operator!((ios *)(ifs1 + *(long *)(*(long *)ifs1 + -0x18)));
  } while ((((uVar3 & 1) == 0) &&
           (uVar3 = std::ios::operator!((ios *)(ifs2 + *(long *)(*(long *)ifs2 + -0x18))),
           (uVar3 & 1) == 0)) && (iVar1 == iVar2));
  return true;
}

Assistant:

static bool cmDependsFortranStreamsDiffer(std::istream& ifs1,
                                          std::istream& ifs2)
{
  // Compare the remaining content.
  for(;;)
    {
    int ifs1_c = ifs1.get();
    int ifs2_c = ifs2.get();
    if(!ifs1 && !ifs2)
      {
      // We have reached the end of both streams simultaneously.
      // The streams are identical.
      return false;
      }

    if(!ifs1 || !ifs2 || ifs1_c != ifs2_c)
      {
      // We have reached the end of one stream before the other or
      // found differing content.  The streams are different.
      break;
      }
    }

  return true;
}